

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O1

void * prepend_alloc(mstate m,char *newbase,char *oldbase,size_t nb)

{
  long lVar1;
  malloc_chunk *pmVar2;
  malloc_tree_chunk *pmVar3;
  malloc_tree_chunk *pmVar4;
  malloc_chunk *pmVar5;
  char *pcVar6;
  malloc_chunk *pmVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  malloc_tree_chunk **ppmVar11;
  mchunkptr pmVar12;
  uint uVar13;
  malloc_chunk *pmVar14;
  ulong uVar15;
  long lVar16;
  tbinptr pmVar17;
  tbinptr pmVar18;
  long *plVar19;
  
  uVar10 = (ulong)(-(int)m - 0x10U & 0xf);
  lVar1 = (long)m->smallbins + (uVar10 - 0x48);
  pmVar18 = (tbinptr)(newbase + (-(int)newbase - 0x10U & 0xf));
  pmVar2 = (malloc_chunk *)(oldbase + lVar1);
  uVar15 = (long)pmVar18 - (long)pmVar2;
  *(ulong *)((long)m->smallbins + (uVar10 - 0x40)) = (ulong)oldbase | 3;
  if (pmVar18 == (tbinptr)_gm_.top) {
    _gm_.topsize = uVar15 + _gm_.topsize;
    _gm_.top = pmVar2;
    pmVar2->head = _gm_.topsize | 1;
    goto LAB_0010899c;
  }
  if (pmVar18 == (tbinptr)_gm_.dv) {
    uVar15 = uVar15 + _gm_.dvsize;
    _gm_.dvsize = uVar15;
    _gm_.dv = pmVar2;
    pmVar2->head = uVar15 | 1;
    *(ulong *)((long)pmVar2 + uVar15) = uVar15;
    goto LAB_0010899c;
  }
  uVar10 = pmVar18->head;
  if (((uint)uVar10 & 3) == 1) {
    if (0xff < uVar10) {
      pmVar17 = pmVar18->bk;
      pmVar3 = pmVar18->parent;
      if (pmVar17 == pmVar18) {
        pmVar17 = pmVar18->child[1];
        if (pmVar17 != (tbinptr)0x0) {
          ppmVar11 = pmVar18->child + 1;
LAB_00108720:
          do {
            if (pmVar17->child[1] == (malloc_tree_chunk *)0x0) {
              if (pmVar17->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x00108734;
              ppmVar11 = pmVar17->child;
            }
            else {
              ppmVar11 = pmVar17->child + 1;
            }
            pmVar17 = *ppmVar11;
          } while( true );
        }
        pmVar17 = pmVar18->child[0];
        if (pmVar17 != (tbinptr)0x0) {
          ppmVar11 = pmVar18->child;
          goto LAB_00108720;
        }
        pmVar17 = (tbinptr)0x0;
      }
      else {
        pmVar4 = pmVar18->fd;
        if (((pmVar4 < _gm_.least_addr) || (pmVar4->bk != pmVar18)) || (pmVar17->fd != pmVar18))
        goto LAB_001089a9;
        pmVar4->bk = pmVar17;
        pmVar17->fd = pmVar4;
      }
      goto LAB_00108748;
    }
    pmVar3 = pmVar18->fd;
    pmVar4 = pmVar18->bk;
    if ((pmVar3 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar10 >> 3) * 2)) &&
       ((pmVar3 < _gm_.least_addr || (pmVar3->bk != pmVar18)))) goto LAB_001089a9;
    if (pmVar4 == pmVar3) {
      bVar8 = (byte)(uVar10 >> 3) & 0x1f;
      _gm_.smallmap = _gm_.smallmap & (-2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8);
    }
    else {
      if ((pmVar4 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar10 >> 3) * 2)) &&
         ((pmVar4 < _gm_.least_addr || (pmVar4->fd != pmVar18)))) goto LAB_001089a9;
      pmVar3->bk = pmVar4;
      pmVar4->fd = pmVar3;
    }
    goto LAB_001087ef;
  }
  goto LAB_001087f9;
code_r0x00108734:
  if (ppmVar11 < _gm_.least_addr) goto LAB_001089a9;
  *ppmVar11 = (malloc_tree_chunk *)0x0;
LAB_00108748:
  if (pmVar3 != (malloc_tree_chunk *)0x0) {
    uVar13 = pmVar18->index;
    if (pmVar18 == _gm_.treebins[uVar13]) {
      _gm_.treebins[uVar13] = pmVar17;
      if (pmVar17 == (tbinptr)0x0) {
        bVar8 = (byte)uVar13 & 0x1f;
        _gm_.treemap = _gm_.treemap & (-2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8);
        goto LAB_001087a2;
      }
    }
    else {
      if (pmVar3 < _gm_.least_addr) goto LAB_001089a9;
      if (pmVar3->child[0] == pmVar18) {
        pmVar3->child[0] = pmVar17;
      }
      else {
        pmVar3->child[1] = pmVar17;
      }
LAB_001087a2:
      if (pmVar17 == (tbinptr)0x0) goto LAB_001087ef;
    }
    pcVar6 = _gm_.least_addr;
    if (pmVar17 < _gm_.least_addr) goto LAB_001089a9;
    pmVar17->parent = pmVar3;
    pmVar3 = pmVar18->child[0];
    if (pmVar3 != (malloc_tree_chunk *)0x0) {
      if (pmVar3 < pcVar6) goto LAB_001089a9;
      pmVar17->child[0] = pmVar3;
      pmVar3->parent = pmVar17;
    }
    pmVar3 = pmVar18->child[1];
    if (pmVar3 != (malloc_tree_chunk *)0x0) {
      if (pmVar3 < pcVar6) goto LAB_001089a9;
      pmVar17->child[1] = pmVar3;
      pmVar3->parent = pmVar17;
    }
  }
LAB_001087ef:
  pmVar18 = (tbinptr)((long)&pmVar18->prev_foot + (uVar10 & 0xfffffffffffffff8));
  uVar15 = uVar15 + (uVar10 & 0xfffffffffffffff8);
LAB_001087f9:
  *(byte *)&pmVar18->head = (byte)pmVar18->head & 0xfe;
  pmVar2->head = uVar15 | 1;
  *(ulong *)((long)&pmVar2->prev_foot + uVar15) = uVar15;
  if (uVar15 < 0x100) {
    uVar15 = uVar15 >> 3;
    if ((_gm_.smallmap >> ((uint)uVar15 & 0x1f) & 1) == 0) {
      _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar15 & 0x1f);
      pmVar12 = (malloc_chunk *)(_gm_.smallbins + uVar15 * 2);
    }
    else {
      pmVar12 = _gm_.smallbins[uVar15 * 2 + 2];
      if (_gm_.smallbins[uVar15 * 2 + 2] < _gm_.least_addr) {
LAB_001089a9:
        abort();
      }
    }
    _gm_.smallbins[uVar15 * 2 + 2] = pmVar2;
    pmVar12->bk = pmVar2;
    pmVar2->fd = pmVar12;
    pmVar2->bk = (malloc_chunk *)(_gm_.smallbins + uVar15 * 2);
  }
  else {
    uVar13 = (uint)(uVar15 >> 8);
    if (uVar13 == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0x1f;
      if (uVar13 < 0x10000) {
        uVar9 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        uVar9 = (uint)((uVar15 >> ((ulong)(byte)(0x26 - (char)(uVar9 ^ 0x1f)) & 0x3f) & 1) != 0) +
                (uVar9 ^ 0x1f) * 2 ^ 0x3e;
      }
    }
    pmVar14 = (malloc_chunk *)(_gm_.treebins + uVar9);
    *(uint *)&pmVar2[1].bk = uVar9;
    pmVar2[1].prev_foot = 0;
    pmVar2[1].head = 0;
    if ((_gm_.treemap >> (uVar9 & 0x1f) & 1) == 0) {
      _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar9 & 0x1f);
      pmVar14->prev_foot = (size_t)pmVar2;
      pmVar2[1].fd = pmVar14;
      pmVar2->bk = pmVar2;
      pmVar2->fd = pmVar2;
    }
    else {
      pmVar14 = (malloc_chunk *)pmVar14->prev_foot;
      bVar8 = 0x39 - (char)(uVar9 >> 1);
      if (uVar9 == 0x1f) {
        bVar8 = 0;
      }
      lVar16 = uVar15 << (bVar8 & 0x3f);
      do {
        if ((pmVar14->head & 0xfffffffffffffff8) == uVar15) {
          if ((pmVar14 < _gm_.least_addr) || (pmVar5 = pmVar14->fd, pmVar5 < _gm_.least_addr))
          goto LAB_001089a9;
          pmVar5->bk = pmVar2;
          pmVar14->fd = pmVar2;
          pmVar2->fd = pmVar5;
          pmVar2->bk = pmVar14;
          pmVar2[1].fd = (malloc_chunk *)0x0;
          break;
        }
        pmVar5 = *(malloc_chunk **)((long)pmVar14 + (lVar16 >> 0x3f) * -8 + 0x20);
        pmVar7 = pmVar5;
        if (pmVar5 == (malloc_chunk *)0x0) {
          plVar19 = (long *)((long)pmVar14 + (lVar16 >> 0x3f) * -8 + 0x20);
          if (plVar19 < _gm_.least_addr) goto LAB_001089a9;
          *plVar19 = (long)pmVar2;
          pmVar2[1].fd = pmVar14;
          pmVar2->bk = pmVar2;
          pmVar2->fd = pmVar2;
          pmVar7 = pmVar14;
        }
        pmVar14 = pmVar7;
        lVar16 = lVar16 * 2;
      } while (pmVar5 != (malloc_chunk *)0x0);
    }
  }
LAB_0010899c:
  return (void *)(lVar1 + 0x10);
}

Assistant:

static void* prepend_alloc(mstate m, char* newbase, char* oldbase,
                           size_t nb) {
  mchunkptr p = align_as_chunk(newbase);
  mchunkptr oldfirst = align_as_chunk(oldbase);
  size_t psize = (char*)oldfirst - (char*)p;
  mchunkptr q = chunk_plus_offset(p, nb);
  size_t qsize = psize - nb;
  set_size_and_pinuse_of_inuse_chunk(m, p, nb);

  assert((char*)oldfirst > (char*)q);
  assert(pinuse(oldfirst));
  assert(qsize >= MIN_CHUNK_SIZE);

  /* consolidate remainder with first chunk of old base */
  if (oldfirst == m->top) {
    size_t tsize = m->topsize += qsize;
    m->top = q;
    q->head = tsize | PINUSE_BIT;
    check_top_chunk(m, q);
  }
  else if (oldfirst == m->dv) {
    size_t dsize = m->dvsize += qsize;
    m->dv = q;
    set_size_and_pinuse_of_free_chunk(q, dsize);
  }
  else {
    if (!is_inuse(oldfirst)) {
      size_t nsize = chunksize(oldfirst);
      unlink_chunk(m, oldfirst, nsize);
      oldfirst = chunk_plus_offset(oldfirst, nsize);
      qsize += nsize;
    }
    set_free_with_pinuse(q, qsize, oldfirst);
    insert_chunk(m, q, qsize);
    check_free_chunk(m, q);
  }

  check_malloced_chunk(m, chunk2mem(p), nb);
  return chunk2mem(p);
}